

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O2

void ini_inv(trobj *trop,short *nocreate)

{
  ushort uVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  obj *poVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  uint booktype;
  long lStackY_50;
  obj *in_stack_ffffffffffffffb8;
  ulong local_38;
  
  pbVar7 = &trop->field_0x4;
LAB_002683d0:
  local_38 = (ulong)(*pbVar7 & 0x3f);
LAB_002683d6:
  cVar10 = trop->trclass;
  if (cVar10 == '\0') {
    return;
  }
  sVar3 = trop->trotyp;
  if (sVar3 == 0) {
    do {
      poVar8 = mkobj(level,cVar10,'\0');
      uVar1 = poVar8->otyp;
      booktype = (uint)(short)uVar1;
      if ((((((booktype != 0x1c2) && (uVar1 != *nocreate)) && (uVar1 != nocreate[1])) &&
           ((uVar1 != nocreate[2] && (uVar1 != nocreate[3])))) &&
          ((uVar1 != 0xaa || flags.elbereth_enabled == '\0' &&
           ((0x3b < uVar1 - 0x141 ||
            ((0x800000300000001U >> ((ulong)(uVar1 - 0x141) & 0x3f) & 1) == 0)))))) &&
         ((1 < uVar1 - 0xab &&
          ((((uVar1 != 0x134 && (uVar1 != 0x1bc)) && (uVar1 != 0x1c3)) &&
           ((urole.malenum != 0x160 || uVar1 != 0x157 && (urole.malenum != 0x168 || uVar1 != 0x187))
           )))))) {
        if (poVar8->oclass != '\n') goto LAB_002685b2;
        if (objects[(int)booktype].oc_oc2 < '\x04') {
          iVar4 = spell_skilltype(booktype);
          if ((ushort)(urole._208_4_ - 0x159) < 0x10) {
            pcVar9 = (&PTR_Skill_A_0030d1f0)[urole._208_4_ - 0x159 & 0xffff];
          }
          else {
            pcVar9 = (char *)0x0;
          }
          while (cVar10 = *pcVar9, cVar10 != '\0') {
            pcVar9 = pcVar9 + 2;
            if (iVar4 == cVar10) goto LAB_002685b2;
          }
        }
      }
      dealloc_obj(poVar8);
      cVar10 = trop->trclass;
    } while( true );
  }
  if (urace.malenum != 0x10b) {
    for (lVar11 = 4; lVar11 != 0x94; lVar11 = lVar11 + 6) {
      if ((*(short *)(&Money[1].field_0x4 + lVar11) == urace.malenum) &&
         (sVar3 == *(short *)(&Money[1].field_0x6 + lVar11))) {
        sVar3 = *(short *)((long)&inv_subs[0].race_pm + lVar11);
        break;
      }
    }
  }
  booktype = (uint)sVar3;
  poVar8 = mksobj(level,booktype,'\x01','\0');
  goto LAB_0026865e;
LAB_002685b2:
  if (((objects[(int)booktype].field_0x10 & 0x20) != 0) && (poVar8->spe < '\x01')) {
    iVar4 = -9;
    while ((iVar4 != 0 && (uVar6 = mt_random(), uVar6 % 5 < 2))) {
      iVar4 = iVar4 + 1;
    }
    poVar8->spe = (char)iVar4 + '\n';
  }
  if (uVar1 == 0xb7) {
LAB_00268638:
    *nocreate = 0xb8;
  }
  else if (uVar1 == 0xb8) {
    nocreate[0] = 0xb7;
    nocreate[1] = 0x19e;
    nocreate[2] = 0x13a;
  }
  else if ((uVar1 == 0x1c9) || (uVar1 == 0x13a)) goto LAB_00268638;
  if ((poVar8->oclass == '\n') || (poVar8->oclass == '\x04')) {
    nocreate[3] = uVar1;
  }
LAB_0026865e:
  if (trop->trclass == '\f') {
    poVar8->quan = u.umoney0;
  }
  else {
    uVar6 = *(uint *)&poVar8->field_0x4a;
    uVar5 = uVar6 | 0xe0;
    *(uint *)&poVar8->field_0x4a = uVar5;
    uVar6 = uVar6 | 0xf0;
    if ((objects[(int)booktype].field_0x10 & 4) == 0) {
      uVar6 = uVar5;
    }
    uVar5 = uVar6 & 0xfffffffe;
    *(uint *)&poVar8->field_0x4a = uVar5;
    if (poVar8->oprops != 0) {
      poVar8->oprops = 0;
    }
    if (((short)uVar6 < 0) && (u.ualign.type != -1)) {
      uVar5 = uVar6 & 0xffff7ffe;
      *(uint *)&poVar8->field_0x4a = uVar5;
    }
    cVar10 = poVar8->oclass;
    if (cVar10 == '\x02') {
LAB_002686f7:
      iVar4 = (int)local_38;
      local_38 = 1;
LAB_00268704:
      poVar8->quan = iVar4;
    }
    else if (cVar10 == '\r') {
      iVar4 = 1;
      if (0xfffc < (ushort)(poVar8->otyp - 0x212U)) goto LAB_00268704;
    }
    else if (cVar10 == '\x06') goto LAB_002686f7;
    if (poVar8->otyp == 0x7a) {
      uVar5 = uVar5 | 1;
      *(uint *)&poVar8->field_0x4a = uVar5;
    }
    if (trop->trspe != '\x7f') {
      poVar8->spe = trop->trspe;
    }
    uVar6 = (uint)((byte)trop->field_0x4 >> 6);
    if (uVar6 != 2) {
      *(uint *)&poVar8->field_0x4a = (uVar5 & 0xfffffffd) + (uVar6 & 1) * 2;
    }
  }
  uVar6 = weight(poVar8);
  poVar8->owt = uVar6;
  poVar8 = addinv(in_stack_ffffffffffffffb8);
  if ((obj_descr[objects[(int)booktype].oc_descr_idx].oc_descr != (char *)0x0) &&
     ((poVar8->field_0x4a & 0x10) != 0)) {
    knows_object(booktype);
  }
  knows_object(0x142);
  bVar2 = poVar8->oclass;
  if ((bVar2 == 3) && (u.roleplay.nudist == '\0')) {
    cVar10 = objects[poVar8->otyp].oc_subtyp;
    if ((cVar10 == '\x01') && (uarms == (obj *)0x0)) {
      setworn(poVar8,8);
      if (uswapwep != (obj *)0x0) {
        setuswapwep((obj *)0x0);
      }
    }
    else {
      if ((cVar10 == '\x02') && (uarmh == (obj *)0x0)) {
        lStackY_50 = 4;
      }
      else if ((cVar10 == '\x03') && (uarmg == (obj *)0x0)) {
        lStackY_50 = 0x10;
      }
      else if ((cVar10 == '\x06') && (uarmu == (obj *)0x0)) {
        lStackY_50 = 0x40;
      }
      else if ((cVar10 == '\x05') && (uarmc == (obj *)0x0)) {
        lStackY_50 = 2;
      }
      else if ((cVar10 == '\x04') && (uarmf == (obj *)0x0)) {
        lStackY_50 = 0x20;
      }
      else {
        if ((cVar10 != '\0') || (uarm != (obj *)0x0)) goto LAB_002688b8;
        lStackY_50 = 1;
      }
      setworn(poVar8,lStackY_50);
    }
LAB_002688b8:
    bVar2 = poVar8->oclass;
  }
  if (bVar2 == 2) {
LAB_00268934:
    cVar10 = objects[poVar8->otyp].oc_subtyp;
    if ((byte)(cVar10 + 0x18U) < 3) {
LAB_00268964:
      if (uquiver == (obj *)0x0) {
        setuqwep(poVar8);
      }
      goto LAB_002689c2;
    }
    if ((bVar2 | 4) == 6) goto LAB_0026895c;
  }
  else if (bVar2 == 6) {
    cVar10 = objects[poVar8->otyp].oc_subtyp;
    if ((booktype != 0xf4) && (cVar10 == '\0')) {
      if ((booktype & 0xfffffffe) != 0x212) goto LAB_002689c2;
      cVar10 = objects[poVar8->otyp].oc_subtyp;
    }
LAB_0026895c:
    if (((byte)(cVar10 + 0x1bU) < 3) || ((bVar2 == 2 && (1 < poVar8->quan)))) goto LAB_00268964;
  }
  else {
    if ((1 < booktype - 0x212) && (booktype != 0xf4)) goto LAB_002689c2;
    if ((bVar2 == 2) || (bVar2 == 0xd)) goto LAB_00268934;
  }
  if ((uwep == (obj *)0x0) && (u.roleplay.pacifist == '\0')) {
    setuwep(poVar8);
  }
  else if (uswapwep == (obj *)0x0) {
    setuswapwep(poVar8);
  }
LAB_002689c2:
  if ((poVar8->oclass == '\n') && (poVar8->otyp != 0x1bc)) {
    initialspell(poVar8);
  }
  if ((poVar8->otyp == 0xee) && (u.roleplay.blindfolded != '\0')) {
    setworn(poVar8,0x80000);
  }
  local_38 = local_38 - 1;
  if (local_38 == 0) goto code_r0x00268a15;
  goto LAB_002683d6;
code_r0x00268a15:
  pbVar7 = &trop[1].field_0x4;
  trop = trop + 1;
  goto LAB_002683d0;
}

Assistant:

static void ini_inv(const struct trobj *trop, short nocreate[4])
{
	struct obj *obj;
	int otyp, i;
	long trquan = trop->trquan;

	while (trop->trclass) {
		if (trop->trotyp != UNDEF_TYP) {
			otyp = (int)trop->trotyp;
			if (urace.malenum != PM_HUMAN) {
			    /* substitute specific items for generic ones */
			    for (i = 0; inv_subs[i].race_pm != NON_PM; ++i)
				if (inv_subs[i].race_pm == urace.malenum &&
					otyp == inv_subs[i].item_otyp) {
				    otyp = inv_subs[i].subs_otyp;
				    break;
				}
			}
			obj = mksobj(level, otyp, TRUE, FALSE);
		} else {	/* UNDEF_TYP */
		/*
		 * For random objects, do not create certain overly powerful
		 * items: wand of wishing, ring of levitation, or the
		 * polymorph/polymorph control combination.  Specific objects,
		 * i.e. the discovery wishing, are still OK.
		 * Also, don't get a couple of really useless items.  (Note:
		 * punishment isn't "useless".  Some players who start out with
		 * one will immediately read it and use the iron ball as a
		 * weapon.)
		 */
			obj = mkobj(level, trop->trclass, FALSE);
			otyp = obj->otyp;
			while (otyp == WAN_WISHING
				|| otyp == nocreate[0]
				|| otyp == nocreate[1]
				|| otyp == nocreate[2]
				|| otyp == nocreate[3]
				|| (otyp == RIN_LEVITATION && flags.elbereth_enabled)
				/* 'useless' items */
				|| otyp == POT_HALLUCINATION
				|| otyp == POT_ACID
				|| otyp == SCR_FLOOD
				|| otyp == SCR_FIRE
				|| otyp == SCR_BLANK_PAPER
				|| otyp == SPE_BLANK_PAPER
				|| otyp == RIN_AGGRAVATE_MONSTER
				|| otyp == RIN_HUNGER
				|| otyp == WAN_NOTHING
				/* Monks don't use weapons */
				|| (otyp == SCR_ENCHANT_WEAPON &&
				    Role_if (PM_MONK))
				/* wizard patch -- they already have one */
				|| (otyp == SPE_FORCE_BOLT &&
				    Role_if (PM_WIZARD))
				/* powerful spells are either useless to
				   low level players or unbalancing; also
				   spells in restricted skill categories */
				|| (obj->oclass == SPBOOK_CLASS &&
				    (objects[otyp].oc_level > 3 ||
				    restricted_spell_discipline(otyp)))
							) {
				dealloc_obj(obj);
				obj = mkobj(level, trop->trclass, FALSE);
				otyp = obj->otyp;
			}

			/* Don't start with +0 or negative rings */
			if (objects[otyp].oc_charged && obj->spe <= 0)
				obj->spe = rne(3);

			/* Heavily relies on the fact that 1) we create wands
			 * before rings, 2) that we create rings before
			 * spellbooks, and that 3) not more than 1 object of a
			 * particular symbol is to be prohibited.  (For more
			 * objects, we need more nocreate variables...)
			 */
			switch (otyp) {
			    case WAN_POLYMORPH:
			    case RIN_POLYMORPH:
			    case POT_POLYMORPH:
				nocreate[0] = RIN_POLYMORPH_CONTROL;
				break;
			    case RIN_POLYMORPH_CONTROL:
				nocreate[0] = RIN_POLYMORPH;
				nocreate[1] = SPE_POLYMORPH;
				nocreate[2] = POT_POLYMORPH;
			}
			/* Don't have 2 of the same ring or spellbook */
			if (obj->oclass == RING_CLASS ||
			    obj->oclass == SPBOOK_CLASS)
				nocreate[3] = otyp;
		}

		if (trop->trclass == COIN_CLASS) {
			/* no "blessed" or "identified" money */
			obj->quan = u.umoney0;
		} else {
			obj->dknown = obj->bknown = obj->rknown = 1;
			if (objects[otyp].oc_uses_known) obj->known = 1;
			obj->cursed = 0;
			if (obj->oprops) obj->oprops = 0L;
			if (obj->opoisoned && u.ualign.type != A_CHAOTIC)
			    obj->opoisoned = 0;
			if (obj->oclass == WEAPON_CLASS ||
				obj->oclass == TOOL_CLASS) {
			    obj->quan = trquan;
			    trquan = 1;
			} else if (obj->oclass == GEM_CLASS &&
				is_graystone(obj) && obj->otyp != FLINT) {
			    obj->quan = 1L;
			}
			if (obj->otyp == STRIPED_SHIRT)
			    obj->cursed = TRUE;
			if (trop->trspe != UNDEF_SPE)
			    obj->spe = trop->trspe;
			if (trop->trbless != UNDEF_BLESS)
			    obj->blessed = trop->trbless;
		}
		/* defined after setting otyp+quan + blessedness */
		obj->owt = weight(obj);
		obj = addinv(obj);

		/* Make the type known if necessary */
		if (OBJ_DESCR(objects[otyp]) && obj->known)
			knows_object(otyp);

		/* pre-ID oil as it's easy to check anyway */
		knows_object(POT_OIL);

		if (obj->oclass == ARMOR_CLASS && !u.roleplay.nudist) {
			if (is_shield(obj) && !uarms) {
				setworn(obj, W_ARMS);
				if (uswapwep) setuswapwep(NULL);
			} else if (is_helmet(obj) && !uarmh)
				setworn(obj, W_ARMH);
			else if (is_gloves(obj) && !uarmg)
				setworn(obj, W_ARMG);
			else if (is_shirt(obj) && !uarmu)
				setworn(obj, W_ARMU);
			else if (is_cloak(obj) && !uarmc)
				setworn(obj, W_ARMC);
			else if (is_boots(obj) && !uarmf)
				setworn(obj, W_ARMF);
			else if (is_suit(obj) && !uarm)
				setworn(obj, W_ARM);
		}

		if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
			otyp == TIN_OPENER || otyp == FLINT || otyp == ROCK) {
		    if (is_ammo(obj) || is_missile(obj) ||
			/* starting weapon stacks are usually for throwing */
			(obj->oclass == WEAPON_CLASS && obj->quan > 1)) {
			if (!uquiver) setuqwep(obj);
		    } else if (!uwep && !u.roleplay.pacifist) setuwep(obj);
		    else if (!uswapwep) setuswapwep(obj);
		}
		if (obj->oclass == SPBOOK_CLASS &&
				obj->otyp != SPE_BLANK_PAPER)
		    initialspell(obj);

		if (obj->otyp == BLINDFOLD && u.roleplay.blindfolded)
		    setworn(obj, W_TOOL);

		if (--trquan) continue;	/* make a similar object */
		trop++;
		trquan = trop->trquan;
	}
}